

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gil.h
# Opt level: O0

void __thiscall pybind11::gil_scoped_acquire::dec_ref(gil_scoped_acquire *this)

{
  PyThreadState *pPVar1;
  internals *piVar2;
  gil_scoped_acquire *this_local;
  
  this->tstate->gilstate_counter = this->tstate->gilstate_counter + -1;
  pPVar1 = detail::get_thread_state_unchecked();
  if (pPVar1 != this->tstate) {
    pybind11_fail("scoped_acquire::dec_ref(): thread state must be current!");
  }
  if (this->tstate->gilstate_counter < 0) {
    pybind11_fail("scoped_acquire::dec_ref(): reference count underflow!");
  }
  if (this->tstate->gilstate_counter == 0) {
    if ((this->release & 1U) == 0) {
      pybind11_fail("scoped_acquire::dec_ref(): internal error!");
    }
    PyThreadState_Clear(this->tstate);
    if ((this->active & 1U) != 0) {
      PyThreadState_DeleteCurrent();
    }
    piVar2 = detail::get_internals();
    PyThread_tss_set(piVar2->tstate,0);
    this->release = false;
  }
  return;
}

Assistant:

PYBIND11_NOINLINE void dec_ref() {
        --tstate->gilstate_counter;
        #if !defined(NDEBUG)
            if (detail::get_thread_state_unchecked() != tstate)
                pybind11_fail("scoped_acquire::dec_ref(): thread state must be current!");
            if (tstate->gilstate_counter < 0)
                pybind11_fail("scoped_acquire::dec_ref(): reference count underflow!");
        #endif
        if (tstate->gilstate_counter == 0) {
            #if !defined(NDEBUG)
                if (!release)
                    pybind11_fail("scoped_acquire::dec_ref(): internal error!");
            #endif
            PyThreadState_Clear(tstate);
            if (active)
                PyThreadState_DeleteCurrent();
            PYBIND11_TLS_DELETE_VALUE(detail::get_internals().tstate);
            release = false;
        }
    }